

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdrex.cpp
# Opt level: O2

SQInteger sqstd_rex_charnode(SQRex *exp,SQBool isclass)

{
  byte bVar1;
  char cVar2;
  char cVar3;
  SQRexNode *pSVar4;
  int iVar5;
  SQInteger SVar6;
  char *pcVar7;
  SQRexNodeType SStack_30;
  
  pcVar7 = exp->_p;
  SStack_30 = (SQRexNodeType)*pcVar7;
  if (SStack_30 != 0x5c) {
    iVar5 = isprint(SStack_30);
    if (iVar5 == 0) {
      pcVar7 = "letter expected";
      goto LAB_00108495;
    }
    exp->_p = pcVar7 + 1;
    goto LAB_0010847f;
  }
  exp->_p = pcVar7 + 1;
  bVar1 = pcVar7[1];
  switch(bVar1) {
  case 0x41:
  case 0x43:
  case 0x44:
  case 0x50:
  case 0x53:
  case 0x57:
  case 0x58:
  case 0x61:
  case 99:
  case 100:
  case 0x6c:
  case 0x70:
  case 0x73:
  case 0x75:
  case 0x77:
  case 0x78:
    exp->_p = pcVar7 + 2;
    SVar6 = sqstd_rex_newnode(exp,0x106);
    exp->_nodes[SVar6].left = (ulong)bVar1;
    return SVar6;
  case 0x42:
  case 0x62:
    if (isclass == 0) {
      SVar6 = sqstd_rex_newnode(exp,0x10c);
      pcVar7 = exp->_p;
      exp->_nodes[SVar6].left = (long)*pcVar7;
      exp->_p = pcVar7 + 1;
      return SVar6;
    }
  case 0x45:
  case 0x46:
  case 0x47:
  case 0x48:
  case 0x49:
  case 0x4a:
  case 0x4b:
  case 0x4c:
  case 0x4d:
  case 0x4e:
  case 0x4f:
  case 0x51:
  case 0x52:
  case 0x54:
  case 0x55:
  case 0x56:
  case 0x59:
  case 0x5a:
  case 0x5b:
  case 0x5c:
  case 0x5d:
  case 0x5e:
  case 0x5f:
  case 0x60:
  case 0x65:
  case 0x67:
  case 0x68:
  case 0x69:
  case 0x6a:
  case 0x6b:
  case 0x6f:
  case 0x71:
switchD_0010834b_caseD_45:
    exp->_p = pcVar7 + 2;
    SStack_30 = (SQRexNodeType)(char)bVar1;
    break;
  case 0x66:
    exp->_p = pcVar7 + 2;
    SStack_30 = 0xc;
    break;
  case 0x6d:
    exp->_p = pcVar7 + 2;
    cVar2 = pcVar7[2];
    exp->_p = pcVar7 + 3;
    cVar3 = pcVar7[3];
    exp->_p = pcVar7 + 4;
    if (((long)cVar2 == 0) || (cVar3 == '\0')) {
      pcVar7 = "balanced chars expected";
    }
    else {
      if (cVar2 != cVar3) {
        SVar6 = sqstd_rex_newnode(exp,0x10d);
        pSVar4 = exp->_nodes;
        pSVar4[SVar6].left = (long)cVar2;
        pSVar4[SVar6].right = (long)cVar3;
        return SVar6;
      }
      pcVar7 = "open/close char can\'t be the same";
    }
LAB_00108495:
    sqstd_rex_error(exp,pcVar7);
  case 0x6e:
    exp->_p = pcVar7 + 2;
    SStack_30 = 10;
    break;
  case 0x72:
    exp->_p = pcVar7 + 2;
    SStack_30 = 0xd;
    break;
  case 0x74:
    exp->_p = pcVar7 + 2;
    SStack_30 = 9;
    break;
  case 0x76:
    exp->_p = pcVar7 + 2;
    SStack_30 = 0xb;
    break;
  default:
    if (bVar1 == 0) {
      pcVar7 = "letter expected for argument of escape sequence";
      goto LAB_00108495;
    }
    goto switchD_0010834b_caseD_45;
  }
LAB_0010847f:
  SVar6 = sqstd_rex_newnode(exp,SStack_30);
  return SVar6;
}

Assistant:

static SQInteger sqstd_rex_charnode(SQRex *exp,SQBool isclass)
{
    SQChar t;
    if(*exp->_p == SQREX_SYMBOL_ESCAPE_CHAR) {
        exp->_p++;
        switch(*exp->_p) {
            case 'n': exp->_p++; return sqstd_rex_newnode(exp,'\n');
            case 't': exp->_p++; return sqstd_rex_newnode(exp,'\t');
            case 'r': exp->_p++; return sqstd_rex_newnode(exp,'\r');
            case 'f': exp->_p++; return sqstd_rex_newnode(exp,'\f');
            case 'v': exp->_p++; return sqstd_rex_newnode(exp,'\v');
            case 'a': case 'A': case 'w': case 'W': case 's': case 'S':
            case 'd': case 'D': case 'x': case 'X': case 'c': case 'C':
            case 'p': case 'P': case 'l': case 'u':
                {
                t = *exp->_p; exp->_p++;
                return sqstd_rex_charclass(exp,t);
                }
            case 'm':
                {
                     SQChar cb, ce; //cb = character begin match ce = character end match
                     cb = *++exp->_p; //skip 'm'
                     ce = *++exp->_p;
                     exp->_p++; //points to the next char to be parsed
                     if ((!cb) || (!ce)) sqstd_rex_error(exp,_SC("balanced chars expected"));
                     if ( cb == ce ) sqstd_rex_error(exp,_SC("open/close char can't be the same"));
                     SQInteger node =  sqstd_rex_newnode(exp,OP_MB);
                     exp->_nodes[node].left = cb;
                     exp->_nodes[node].right = ce;
                     return node;
                }
            case 0:
                sqstd_rex_error(exp,_SC("letter expected for argument of escape sequence"));
                break;
            case 'b':
            case 'B':
                if(!isclass) {
                    SQInteger node = sqstd_rex_newnode(exp,OP_WB);
                    exp->_nodes[node].left = *exp->_p;
                    exp->_p++;
                    return node;
                } //else default
            default:
                t = *exp->_p; exp->_p++;
                return sqstd_rex_newnode(exp,t);
        }
    }
    else if(!scisprint(*exp->_p)) {

        sqstd_rex_error(exp,_SC("letter expected"));
    }
    t = *exp->_p; exp->_p++;
    return sqstd_rex_newnode(exp,t);
}